

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash-util.cc
# Opt level: O2

hash_code wabt::HashCombine(hash_code seed,hash_code y)

{
  return (seed >> 2) + 0x9e3779b97f4a7c16 + seed * 0x40 + y ^ seed;
}

Assistant:

hash_code HashCombine(hash_code seed, hash_code y) {
#if SIZEOF_SIZE_T == 4
  constexpr hash_code magic = 0x9e3779b9;
#elif SIZEOF_SIZE_T == 8
  constexpr hash_code magic = 0x9e3779b97f4a7c16;
#else
#error "weird sizeof size_t"
#endif
  seed ^= y + magic + (seed << 6) + (seed >> 2);
  return seed;
}